

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getVectorArrayList_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this,GLuint columns,GLuint size)

{
  string local_48;
  uint local_28;
  undefined1 local_21;
  GLuint col;
  GLuint local_1c;
  GLuint size_local;
  GLuint columns_local;
  InitializerListTest *this_local;
  string *result;
  
  local_21 = 0;
  col = size;
  local_1c = columns;
  _size_local = this;
  this_local = (InitializerListTest *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_28 = 0; local_28 < local_1c; local_28 = local_28 + 1) {
    getVectorInitializer_abi_cxx11_(&local_48,this,local_28,col);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_48);
    if (local_28 + 1 < local_1c) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getVectorArrayList(GLuint columns, GLuint size)
{
	std::string result;

	for (GLuint col = 0; col < columns; ++col)
	{
		result.append(getVectorInitializer(col, size));

		if (col + 1 < columns)
		{
			result.append(", ");
		}
	}

	return result;
}